

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

int __thiscall
cmCPackIFWPackage::ConfigureFromComponent(cmCPackIFWPackage *this,cmCPackComponent *component)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  mapped_type *pmVar3;
  vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *this_00;
  reference ppcVar4;
  mapped_type *__x;
  size_type sVar5;
  string *psVar6;
  ostream *poVar7;
  string *psVar8;
  char *pcVar9;
  pair<std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>,_bool> pVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  string local_548 [32];
  undefined1 local_528 [8];
  ostringstream cmCPackLog_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  cmValue local_390;
  cmValue option_3;
  undefined1 local_368 [8];
  ostringstream cmCPackLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  cmValue local_1c8;
  cmValue option_2;
  cmCPackComponent *local_1b0;
  cmCPackComponent *dep;
  iterator __end2;
  iterator __begin2;
  vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  cmValue local_168;
  cmValue option_1;
  cmValue local_140;
  cmValue option;
  string local_130;
  cmValue local_110;
  cmValue optPACKAGE_VERSION;
  cmValue local_e8;
  cmValue optVERSION;
  key_type local_d8;
  allocator<char> local_b1;
  key_type local_b0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string prefix;
  cmCPackComponent *component_local;
  cmCPackIFWPackage *this_local;
  
  if (component == (cmCPackComponent *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    prefix.field_2._8_8_ = component;
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase(&local_80,(string *)prefix.field_2._8_8_);
    std::operator+(&local_60,"CPACK_IFW_COMPONENT_",&local_80);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,"_");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    psVar8 = (string *)(prefix.field_2._8_8_ + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->DisplayName,&local_b0);
    std::__cxx11::string::operator=((string *)pmVar3,psVar8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    psVar8 = (string *)(prefix.field_2._8_8_ + 0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"",(allocator<char> *)((long)&optVERSION.Value + 7));
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->Description,&local_d8);
    std::__cxx11::string::operator=((string *)pmVar3,psVar8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&optVERSION.Value + 7));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &optPACKAGE_VERSION,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "VERSION");
    local_e8 = cmCPackIFWCommon::GetOption
                         (&this->super_cmCPackIFWCommon,(string *)&optPACKAGE_VERSION);
    std::__cxx11::string::~string((string *)&optPACKAGE_VERSION);
    bVar2 = cmValue::operator_cast_to_bool(&local_e8);
    if (bVar2) {
      psVar6 = cmValue::operator*[abi_cxx11_(&local_e8);
      std::__cxx11::string::operator=((string *)&this->Version,(string *)psVar6);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"CPACK_PACKAGE_VERSION",
                 (allocator<char> *)((long)&option.Value + 7));
      local_110 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)((long)&option.Value + 7));
      bVar2 = cmValue::operator_cast_to_bool(&local_110);
      if (bVar2) {
        psVar6 = cmValue::operator*[abi_cxx11_(&local_110);
        std::__cxx11::string::operator=((string *)&this->Version,(string *)psVar6);
      }
      else {
        std::__cxx11::string::operator=((string *)&this->Version,"1.0.0");
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&option_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "SCRIPT");
    local_140 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&option_1);
    std::__cxx11::string::~string((string *)&option_1);
    bVar2 = cmValue::operator_cast_to_bool(&local_140);
    if (bVar2) {
      psVar6 = cmValue::operator*[abi_cxx11_(&local_140);
      std::__cxx11::string::operator=((string *)&this->Script,(string *)psVar6);
    }
    std::operator+(&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "USER_INTERFACES");
    local_168 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    bVar2 = cmValue::operator_cast_to_bool(&local_168);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->UserInterfaces);
      cmExpandList(local_168,&this->UserInterfaces,No);
    }
    bVar2 = std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::empty
                      ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                       (prefix.field_2._8_8_ + 200));
    if (!bVar2) {
      this_00 = (vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                (prefix.field_2._8_8_ + 200);
      __end2 = std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::begin(this_00);
      dep = (cmCPackComponent *)
            std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::end(this_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                                         *)&dep), bVar2) {
        ppcVar4 = __gnu_cxx::
                  __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                  ::operator*(&__end2);
        local_1b0 = *ppcVar4;
        __x = std::
              map<cmCPackComponent_*,_cmCPackIFWPackage_*,_std::less<cmCPackComponent_*>,_std::allocator<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>_>
              ::operator[](&((this->super_cmCPackIFWCommon).Generator)->ComponentPackages,&local_1b0
                          );
        pVar10 = std::
                 set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
                 ::insert(&this->Dependencies,__x);
        option_2.Value = (string *)pVar10.first._M_node;
        __gnu_cxx::
        __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
        ::operator++(&__end2);
      }
    }
    std::operator+(&local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "LICENSES");
    local_1c8 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    bVar2 = cmValue::operator_cast_to_bool(&local_1c8);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->Licenses);
      cmExpandList(local_1c8,&this->Licenses,No);
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->Licenses);
      if ((sVar5 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
        poVar7 = std::operator<<((ostream *)local_368,(string *)local_40);
        poVar7 = std::operator<<(poVar7,"LICENSES");
        poVar7 = std::operator<<(poVar7," should contain pairs of <display_name> and <file_path>.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
          pcVar1 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar9 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,0xf4,pcVar9);
          std::__cxx11::string::~string((string *)&option_3);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&this->Licenses);
      }
    }
    std::operator+(&local_3b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "PRIORITY");
    local_390 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    bVar2 = cmValue::operator_cast_to_bool(&local_390);
    if (bVar2) {
      psVar6 = cmValue::operator*[abi_cxx11_(&local_390);
      std::__cxx11::string::operator=((string *)&this->SortingPriority,(string *)psVar6);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
      poVar7 = std::operator<<((ostream *)local_528,"The \"PRIORITY\" option is set ");
      poVar7 = std::operator<<(poVar7,"for component \"");
      poVar7 = std::operator<<(poVar7,(string *)prefix.field_2._8_8_);
      poVar7 = std::operator<<(poVar7,"\", but there option is ");
      poVar7 = std::operator<<(poVar7,"deprecated. Please use \"SORTING_PRIORITY\" option instead.")
      ;
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
        pcVar1 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                        ,0x101,pcVar9);
        std::__cxx11::string::~string(local_548);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
    }
    pcVar9 = "true";
    if ((*(uint *)(prefix.field_2._8_8_ + 0x48) >> 2 & 1) != 0) {
      pcVar9 = "false";
    }
    std::__cxx11::string::operator=((string *)&this->Default,pcVar9);
    std::operator+(&local_568,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "ESSENTIAL");
    bVar2 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_568);
    std::__cxx11::string::~string((string *)&local_568);
    if (bVar2) {
      std::__cxx11::string::operator=((string *)&this->Essential,"true");
    }
    pcVar9 = "";
    if ((*(uint *)(prefix.field_2._8_8_ + 0x48) >> 1 & 1) != 0) {
      pcVar9 = "true";
    }
    std::__cxx11::string::operator=((string *)&this->Virtual,pcVar9);
    pcVar9 = "false";
    if ((*(byte *)(prefix.field_2._8_8_ + 0x48) & 1) != 0) {
      pcVar9 = "true";
    }
    std::__cxx11::string::operator=((string *)&this->ForcedInstallation,pcVar9);
    this_local._4_4_ = ConfigureFromPrefix(this,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromComponent(cmCPackComponent* component)
{
  if (!component) {
    return 0;
  }

  // Restore default configuration
  this->DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_" +
    cmsys::SystemTools::UpperCase(component->Name) + "_";

  // Display name
  this->DisplayName[""] = component->DisplayName;

  // Description
  this->Description[""] = component->Description;

  // Version
  if (cmValue optVERSION = this->GetOption(prefix + "VERSION")) {
    this->Version = *optVERSION;
  } else if (cmValue optPACKAGE_VERSION =
               this->GetOption("CPACK_PACKAGE_VERSION")) {
    this->Version = *optPACKAGE_VERSION;
  } else {
    this->Version = "1.0.0";
  }

  // Script
  if (cmValue option = this->GetOption(prefix + "SCRIPT")) {
    this->Script = *option;
  }

  // User interfaces
  if (cmValue option = this->GetOption(prefix + "USER_INTERFACES")) {
    this->UserInterfaces.clear();
    cmExpandList(option, this->UserInterfaces);
  }

  // CMake dependencies
  if (!component->Dependencies.empty()) {
    for (cmCPackComponent* dep : component->Dependencies) {
      this->Dependencies.insert(this->Generator->ComponentPackages[dep]);
    }
  }

  // Licenses
  if (cmValue option = this->GetOption(prefix + "LICENSES")) {
    this->Licenses.clear();
    cmExpandList(option, this->Licenses);
    if (this->Licenses.size() % 2 != 0) {
      cmCPackIFWLogger(
        WARNING,
        prefix << "LICENSES"
               << " should contain pairs of <display_name> and <file_path>."
               << std::endl);
      this->Licenses.clear();
    }
  }

  // Priority
  if (cmValue option = this->GetOption(prefix + "PRIORITY")) {
    this->SortingPriority = *option;
    cmCPackIFWLogger(
      WARNING,
      "The \"PRIORITY\" option is set "
        << "for component \"" << component->Name << "\", but there option is "
        << "deprecated. Please use \"SORTING_PRIORITY\" option instead."
        << std::endl);
  }

  // Default
  this->Default = component->IsDisabledByDefault ? "false" : "true";

  // Essential
  if (this->IsOn(prefix + "ESSENTIAL")) {
    this->Essential = "true";
  }

  // Virtual
  this->Virtual = component->IsHidden ? "true" : "";

  // ForcedInstallation
  this->ForcedInstallation = component->IsRequired ? "true" : "false";

  return this->ConfigureFromPrefix(prefix);
}